

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertModel(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *this)

{
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this_00 = &this->flat_cvt_;
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<mp::ArrayRef<int>_(const_mp::SuffixDef<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:133:9)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<mp::ArrayRef<int>_(const_mp::SuffixDef<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:133:9)>
             ::_M_manager;
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:135:9)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<mp::ArrayRef<double>_(const_mp::SuffixDef<double>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:135:9)>
             ::_M_manager;
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_mp::SuffixDef<int>_&,_mp::ArrayRef<int>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:137:9)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_mp::SuffixDef<int>_&,_mp::ArrayRef<int>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:137:9)>
             ::_M_manager;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(const_mp::SuffixDef<double>_&,_mp::ArrayRef<double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:139:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_mp::SuffixDef<double>_&,_mp::ArrayRef<double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/include/mp/flat/problem_flattener.h:139:9)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  local_78._M_unused._M_object = this;
  local_58._M_unused._M_object = this;
  local_38._M_unused._M_object = this;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::SetSuffixManip((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)this_00,(SuffixGetterSetter *)&local_98);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::OpenGraphExporter((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)this_00);
  ConvertStandardItems(this);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::FinishModelInput((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)this_00);
  return;
}

Assistant:

void ConvertModel() override {
    GetFlatCvt().SetSuffixManip( {
        [this](const SuffixDef<int>& sd)
                                 { return GetModel().ReadIntSuffix(sd); },
        [this](const SuffixDef<double>& sd)
                                 { return GetModel().ReadDblSuffix(sd); },
        [this](const SuffixDef<int>& sd, ArrayRef<int> data)
                                 { GetModel().ReportSuffix(sd, data); },
        [this](const SuffixDef<double>& sd, ArrayRef<double> data)
                                 { GetModel().ReportSuffix(sd, data); }
    } );
    GetFlatCvt().StartModelInput();
    MP_DISPATCH( ConvertStandardItems() );
    GetFlatCvt().FinishModelInput();      // Chance to flush to the Backend
  }